

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdPerform_rec(word t,char *pBuffer,int Pos,int *pVars,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  word wVar8;
  long lVar9;
  ulong uVar10;
  uint nVars_00;
  char *__format;
  char cVar11;
  word wVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int CountCur;
  int pVarsNew [6];
  ulong local_c8;
  char pNest [10];
  word Cof1 [6];
  word Cof0 [6];
  
  if (1999 < Pos) {
    __assert_fail("Pos < DAU_MAX_STR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2a7,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  uVar14 = 0;
  uVar10 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar10 = uVar14;
  }
  nVars_00 = 0;
  for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
    iVar2 = pVars[uVar14];
    iVar1 = Abc_Tt6HasVar(t,iVar2);
    if (iVar1 != 0) {
      lVar4 = (long)(int)nVars_00;
      nVars_00 = nVars_00 + 1;
      pVarsNew[lVar4] = iVar2;
    }
  }
  if ((int)nVars_00 < 1) {
    __assert_fail("nVarsNew > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2ad,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  if (nVars_00 == 1) {
    if (s_Truths6[pVarsNew[0]] == t) {
      iVar2 = Pos + 1;
      pBuffer[Pos] = (char)pVarsNew[0] + 'a';
    }
    else {
      if ((s_Truths6[pVarsNew[0]] ^ t) != 0xffffffffffffffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,700,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
      }
      pBuffer[Pos] = '!';
      iVar2 = Pos + 2;
      pBuffer[(long)Pos + 1] = (char)pVarsNew[0] + 'a';
    }
    return iVar2;
  }
  uVar14 = (ulong)nVars_00;
  uVar10 = 0;
  while (uVar14 != uVar10) {
    iVar2 = pVarsNew[uVar10];
    wVar5 = Abc_Tt6Cofactor0(t,iVar2);
    Cof0[uVar10] = wVar5;
    wVar6 = Abc_Tt6Cofactor1(t,iVar2);
    Cof1[uVar10] = wVar6;
    if (wVar5 == wVar6) {
      __assert_fail("Cof0[v] != Cof1[v]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                    ,0x2c4,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
    }
    cVar11 = (char)iVar2;
    if (wVar5 == 0xffffffffffffffff) {
      (pBuffer + Pos)[0] = '!';
      (pBuffer + Pos)[1] = '(';
      iVar2 = Pos + 3;
      pBuffer[(long)Pos + 2] = cVar11 + 'a';
      wVar5 = ~wVar6;
LAB_0042ebce:
      iVar2 = Dau_DsdPerform_rec(wVar5,pBuffer,iVar2,pVarsNew,nVars_00);
      pBuffer[iVar2] = ')';
      return iVar2 + 1;
    }
    if (wVar5 == 0) {
      pBuffer[Pos] = '(';
      iVar2 = Pos + 2;
      pBuffer[(long)Pos + 1] = cVar11 + 'a';
      wVar5 = wVar6;
      goto LAB_0042ebce;
    }
    if (wVar6 == 0xffffffffffffffff) {
      (pBuffer + Pos)[0] = '!';
      (pBuffer + Pos)[1] = '(';
      pBuffer[(long)Pos + 2] = '!';
      iVar2 = Pos + 4;
      pBuffer[(long)Pos + 3] = cVar11 + 'a';
      wVar5 = ~wVar5;
      goto LAB_0042ebce;
    }
    if (wVar6 == 0) {
      (pBuffer + Pos)[0] = '(';
      (pBuffer + Pos)[1] = '!';
      iVar2 = Pos + 3;
      pBuffer[(long)Pos + 2] = cVar11 + 'a';
      goto LAB_0042ebce;
    }
    uVar10 = uVar10 + 1;
    if ((wVar6 ^ wVar5) == 0xffffffffffffffff) {
      pBuffer[Pos] = '[';
      pBuffer[(long)Pos + 1] = cVar11 + 'a';
      iVar2 = Dau_DsdPerform_rec(wVar5,pBuffer,Pos + 2,pVarsNew,nVars_00);
      pBuffer[iVar2] = ']';
      return iVar2 + 1;
    }
  }
  lVar4 = 1;
  uVar10 = 0;
  while (uVar10 != uVar14) {
    lVar9 = lVar4;
    while ((int)lVar9 < (int)nVars_00) {
      wVar5 = Cof0[uVar10];
      iVar2 = pVarsNew[lVar9];
      wVar6 = Abc_Tt6Cofactor0(wVar5,iVar2);
      wVar7 = Abc_Tt6Cofactor1(wVar5,iVar2);
      wVar5 = Cof1[uVar10];
      wVar8 = Abc_Tt6Cofactor0(wVar5,iVar2);
      wVar5 = Abc_Tt6Cofactor1(wVar5,iVar2);
      if ((wVar6 == wVar7) && (wVar6 == wVar8)) {
        sprintf(pNest,"(%c%c)",(ulong)(pVarsNew[uVar10] + 0x61),(ulong)(iVar2 + 0x61));
        iVar1 = Dau_DsdPerform_rec((wVar5 ^ wVar6) & s_Truths6[iVar2] ^ wVar6,pBuffer,Pos,pVarsNew,
                                   nVars_00);
        goto LAB_0042ed85;
      }
      if ((wVar6 == wVar7) && (wVar6 == wVar5)) {
        sprintf(pNest,"(%c!%c)",(ulong)(pVarsNew[uVar10] + 0x61),(ulong)(iVar2 + 0x61));
        iVar1 = Dau_DsdPerform_rec((wVar8 ^ wVar6) & s_Truths6[iVar2] ^ wVar6,pBuffer,Pos,pVarsNew,
                                   nVars_00);
        goto LAB_0042ed85;
      }
      wVar12 = wVar7;
      if ((wVar6 == wVar8) && (wVar6 == wVar5)) {
        iVar1 = pVarsNew[uVar10];
        __format = "(!%c%c)";
        goto LAB_0042ed40;
      }
      if ((wVar7 == wVar8) && (wVar7 == wVar5)) {
        iVar1 = pVarsNew[uVar10];
        __format = "(!%c!%c)";
        wVar12 = wVar6;
        wVar6 = wVar7;
        goto LAB_0042ed40;
      }
      lVar9 = lVar9 + 1;
      if ((wVar7 == wVar8) && (wVar6 == wVar5)) {
        iVar1 = pVarsNew[uVar10];
        __format = "[%c%c]";
LAB_0042ed40:
        sprintf(pNest,__format,(ulong)(iVar1 + 0x61),(ulong)(iVar2 + 0x61));
        iVar1 = Dau_DsdPerform_rec((wVar12 ^ wVar6) & s_Truths6[iVar2] ^ wVar6,pBuffer,Pos,pVarsNew,
                                   nVars_00);
LAB_0042ed85:
        iVar2 = Dau_DsdPerformReplace(pBuffer,Pos,iVar1,iVar2 + 0x61,pNest);
        return iVar2;
      }
    }
    lVar4 = lVar4 + 1;
    uVar10 = uVar10 + 1;
  }
  iVar2 = 10;
  uVar10 = 0xffffffffffffffff;
  for (uVar13 = 0; iVar1 = (int)uVar10, uVar13 != uVar14; uVar13 = uVar13 + 1) {
    local_c8 = uVar10 & 0xffffffff;
    iVar15 = 0;
    for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar13 != uVar10) {
        iVar1 = pVarsNew[uVar10];
        iVar3 = Abc_Tt6HasVar(Cof0[uVar13],iVar1);
        if (iVar3 != 0) {
          iVar1 = Abc_Tt6HasVar(Cof1[uVar13],iVar1);
          iVar15 = iVar15 + iVar1;
        }
      }
    }
    if (iVar15 < iVar2) {
      local_c8 = uVar13;
    }
    uVar10 = local_c8 & 0xffffffff;
    iVar1 = (int)local_c8;
    if (iVar15 == 0) break;
    if (iVar15 <= iVar2) {
      iVar2 = iVar15;
    }
  }
  pBuffer[Pos] = '<';
  pBuffer[(long)Pos + 1] = (char)pVarsNew[iVar1] + 'a';
  iVar2 = Dau_DsdPerform_rec(Cof1[iVar1],pBuffer,Pos + 2,pVarsNew,nVars_00);
  iVar2 = Dau_DsdPerform_rec(Cof0[iVar1],pBuffer,iVar2,pVarsNew,nVars_00);
  pBuffer[iVar2] = '>';
  return iVar2 + 1;
}

Assistant:

int Dau_DsdPerform_rec( word t, char * pBuffer, int Pos, int * pVars, int nVars )
{
    char pNest[10];
    word Cof0[6], Cof1[6], Cof[4];
    int pVarsNew[6], nVarsNew, PosStart;
    int v, u, vBest, CountBest;
    assert( Pos < DAU_MAX_STR );
    // perform support minimization
    nVarsNew = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_Tt6HasVar( t, pVars[v] ) )
            pVarsNew[ nVarsNew++ ] = pVars[v];
    assert( nVarsNew > 0 );
    // special case when function is a var
    if ( nVarsNew == 1 )
    {
        if ( t == s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        if ( t == ~s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        assert( 0 );
        return Pos;
    }
    // decompose on the output side
    for ( v = 0; v < nVarsNew; v++ )
    {
        Cof0[v] = Abc_Tt6Cofactor0( t, pVarsNew[v] );
        Cof1[v] = Abc_Tt6Cofactor1( t, pVarsNew[v] );
        assert( Cof0[v] != Cof1[v] );
        if ( Cof0[v] == 0 ) // ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~(word)0 ) // !(ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == 0 ) // !ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == ~(word)0 ) // !(!ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~Cof1[v] ) // a^x
        {
            pBuffer[Pos++] = '[';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ']';
            return Pos;
        }
    }
    // decompose on the input side
    for ( v = 0; v < nVarsNew; v++ )
    for ( u = v+1; u < nVarsNew; u++ )
    {
        Cof[0] = Abc_Tt6Cofactor0( Cof0[v], pVarsNew[u] );
        Cof[1] = Abc_Tt6Cofactor1( Cof0[v], pVarsNew[u] );
        Cof[2] = Abc_Tt6Cofactor0( Cof1[v], pVarsNew[u] );
        Cof[3] = Abc_Tt6Cofactor1( Cof1[v], pVarsNew[u] );
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[2] ) // vu
        {
            PosStart = Pos;
            sprintf( pNest, "(%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[3]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[3] ) // v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[2]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[2] && Cof[0] == Cof[3] ) // !vu
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[1] == Cof[2] && Cof[1] == Cof[3] ) // !v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[0]) | (~s_Truths6[pVarsNew[u]] & Cof[1]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[3] && Cof[1] == Cof[2] ) // v+u
        {
            PosStart = Pos;
            sprintf( pNest, "[%c%c]", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
    } 
    // find best variable for MUX decomposition
    vBest = -1;
    CountBest = 10;
    for ( v = 0; v < nVarsNew; v++ )
    {
        int CountCur = 0;
        for ( u = 0; u < nVarsNew; u++ )
            if ( u != v && Abc_Tt6HasVar(Cof0[v], pVarsNew[u]) && Abc_Tt6HasVar(Cof1[v], pVarsNew[u]) )
                CountCur++;
        if ( CountBest > CountCur )
        {
            CountBest = CountCur;
            vBest = v;
        }
        if ( CountCur == 0 )
            break;
    }
    // perform MUX decomposition
    pBuffer[Pos++] = '<';
    pBuffer[Pos++] = 'a' + pVarsNew[vBest];
    Pos = Dau_DsdPerform_rec( Cof1[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    Pos = Dau_DsdPerform_rec( Cof0[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    pBuffer[Pos++] = '>';
    return Pos;
}